

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer-test.cc
# Opt level: O3

void __thiscall
Buffer_change_event_add_buffer_Test::TestBody(Buffer_change_event_add_buffer_Test *this)

{
  void *pvVar1;
  size_t sVar2;
  size_t sVar3;
  char *pcVar4;
  initializer_list<bfy_changed_cb_info> __l;
  BufferWithReadonlyStrings local;
  BufferWithReadonlyStrings donor;
  allocator_type local_1d9;
  AssertHelper local_1d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_1d0;
  undefined1 local_1c8 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_1c0;
  pointer local_1b8;
  bfy_changed_cb_info local_1b0;
  BufferWithReadonlyStrings local_198;
  BufferWithReadonlyStrings local_d8;
  
  anon_unknown.dwarf_1ffc5::BufferWithReadonlyStrings::BufferWithReadonlyStrings(&local_198);
  anon_unknown.dwarf_1ffc5::BufferWithReadonlyStrings::BufferWithReadonlyStrings(&local_d8);
  sVar2 = bfy_buffer_get_content_len(&local_198.buf);
  sVar3 = bfy_buffer_get_content_len(&local_d8.buf);
  bfy_buffer_set_changed_cb
            (&local_198.buf,
             (anonymous_namespace)::BufferWithReadonlyStrings::start_listening_to_changes()::
             {lambda(auto:1*,auto:2_const*,void*)#1}::__invoke<bfy_buffer,bfy_changed_cb_info>,
             &local_198.changes);
  local_1b0.orig_size = (ulong)local_1b0.orig_size._4_4_ << 0x20;
  local_1d8.data_._0_4_ = bfy_buffer_add_buffer(&local_198.buf,&local_d8.buf);
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)local_1c8,"0","bfy_buffer_add_buffer(&local.buf, &donor.buf)",
             (int *)&local_1b0,(int *)&local_1d8);
  if (local_1c8[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_1b0);
    if (local_1c0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = (local_1c0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_1d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/ckerr[P]buffy/tests/buffer-test.cc"
               ,0x54d,pcVar4);
    testing::internal::AssertHelper::operator=(&local_1d8,(Message *)&local_1b0);
    testing::internal::AssertHelper::~AssertHelper(&local_1d8);
    if ((long *)local_1b0.orig_size != (long *)0x0) {
      (**(code **)(*(long *)local_1b0.orig_size + 8))();
    }
  }
  if (local_1c0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_1c0,local_1c0);
  }
  local_1b0.n_deleted = 0;
  __l._M_len = 1;
  __l._M_array = &local_1b0;
  local_1b0.orig_size = sVar2;
  local_1b0.n_added = sVar3;
  std::vector<bfy_changed_cb_info,_std::allocator<bfy_changed_cb_info>_>::vector
            ((vector<bfy_changed_cb_info,_std::allocator<bfy_changed_cb_info>_> *)local_1c8,__l,
             &local_1d9);
  testing::internal::
  CmpHelperEQ<std::vector<bfy_changed_cb_info,std::allocator<bfy_changed_cb_info>>,std::vector<bfy_changed_cb_info,std::allocator<bfy_changed_cb_info>>>
            ((internal *)&local_1d8,"changes_t{expected}","local.changes",
             (vector<bfy_changed_cb_info,_std::allocator<bfy_changed_cb_info>_> *)local_1c8,
             &local_198.changes);
  pvVar1 = (void *)CONCAT71(local_1c8._1_7_,local_1c8[0]);
  if (pvVar1 != (void *)0x0) {
    operator_delete(pvVar1,(long)local_1b8 - (long)pvVar1);
  }
  if (local_1d8.data_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)local_1c8);
    if (local_1d0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = (local_1d0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_1b0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/ckerr[P]buffy/tests/buffer-test.cc"
               ,0x54e,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_1b0,(Message *)local_1c8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_1b0);
    if ((long *)CONCAT71(local_1c8._1_7_,local_1c8[0]) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(local_1c8._1_7_,local_1c8[0]) + 8))();
    }
  }
  if (local_1d0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_1d0,local_1d0);
  }
  anon_unknown.dwarf_1ffc5::BufferWithReadonlyStrings::~BufferWithReadonlyStrings(&local_d8);
  anon_unknown.dwarf_1ffc5::BufferWithReadonlyStrings::~BufferWithReadonlyStrings(&local_198);
  return;
}

Assistant:

TEST(Buffer, change_event_add_buffer) {
    BufferWithReadonlyStrings local;
    BufferWithReadonlyStrings donor;
    auto const expected = bfy_changed_cb_info {
        .orig_size = bfy_buffer_get_content_len(&local.buf),
        .n_added = bfy_buffer_get_content_len(&donor.buf),
        .n_deleted = 0
    };

    local.start_listening_to_changes();
    EXPECT_EQ(0, bfy_buffer_add_buffer(&local.buf, &donor.buf));
    EXPECT_EQ(changes_t{expected}, local.changes);
}